

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O2

void __thiscall ValidateFootprint::ReadFootprintFile(ValidateFootprint *this)

{
  Validate *this_00;
  pointer piVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  float local_48;
  OASIS_FLOAT local_44;
  int *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_44 = 0.0;
  ReadFirstFootprintLine(this,&local_44);
  if (this->convertToBin_ == true) {
    (*this->_vptr_ValidateFootprint[1])(this);
  }
  this_00 = &this->super_Validate;
  local_48 = local_44;
  local_38 = &this->intensityBinIDs_;
  local_40 = &(this->fr_).super_EventRow.intensity_bin_id;
  while( true ) {
    pcVar4 = fgets(this_00->line_,0x1000,_stdin);
    if (pcVar4 == (char *)0x0) break;
    iVar2 = ScanLine(this);
    if (iVar2 == 4) {
      iVar2 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,this->eveIDName_,this->initialEveID_);
      (this->fr_).event_id = iVar2;
      uVar3 = Validate::CheckIDDoesNotExceedMaxLimit
                        (this_00,this->areaperilIDName_,this->initialAreaperilID_);
      (this->fr_).super_EventRow.areaperil_id = uVar3;
      if (((this->fr_).event_id == this->prevEventID_) && (uVar3 == this->prevAreaPerilID_)) {
        CheckIntensityBins(this);
        local_48 = local_48 + (this->fr_).super_EventRow.probability;
      }
      else {
        CheckProbability(this,local_48);
        CheckOrder(this);
        piVar1 = (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar1) {
          (this->intensityBinIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar1;
        }
        std::vector<int,_std::allocator<int>_>::push_back(local_38,local_40);
        local_48 = (this->fr_).super_EventRow.probability;
      }
      if (this->convertToBin_ == true) {
        if ((this->fr_).event_id != this->prevEventID_) {
          (*this->_vptr_ValidateFootprint[2])(this);
        }
        (*this->_vptr_ValidateFootprint[1])(this);
      }
      else {
        iVar2 = (this->fr_).super_EventRow.intensity_bin_id;
        if (this->maxIntensityBin_ < iVar2) {
          this->maxIntensityBin_ = iVar2;
        }
      }
      StoreLine(this);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_Validate).lineno_,this_00);
      Validate::PrintErrorMessage(this_00);
    }
  }
  CheckProbability(this,local_48);
  CheckOrder(this);
  if (this->convertToBin_ == true) {
    (*this->_vptr_ValidateFootprint[2])(this);
    return;
  }
  return;
}

Assistant:

void ValidateFootprint::ReadFootprintFile() {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check:
 * 
 * - Total probability for each event ID-areaperil ID pair sums to 1.0.
 * - Event and areaperil IDs are in ascending order.
 * - Unique intensity bin IDs for each event ID-areaperil ID pair. */

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstFootprintLine(totalProbability);
  if (convertToBin_) WriteBinFootprintFile();   // Write first footprint line

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // New event and/or areaperil IDs.
      // Check probabilities sum to 1.0 for each event ID-areaperil ID
      // combination and event IDs and areaperil IDs are in ascending order.
      if ((fr_.event_id != prevEventID_) || 
	  (fr_.areaperil_id != prevAreaPerilID_)) {

        CheckProbability(totalProbability);
	CheckOrder();

	// Reset for next event
	intensityBinIDs_.clear();
	intensityBinIDs_.push_back(fr_.intensity_bin_id);
	totalProbability = fr_.probability;

      } else {

        CheckIntensityBins();
	totalProbability += fr_.probability;

      }

      if (convertToBin_) {

	if (fr_.event_id != prevEventID_) WriteIdxFootprintFile();
        WriteBinFootprintFile();

      } else {

        // Maximum intensity bin index value is required for binary conversion
	// in the future.
        SetMaximumIntensityBinIndex();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last event ID-areaperil ID combination
  // and event IDs and areaperil IDs are in ascending order for last row
  CheckProbability(totalProbability);
  CheckOrder();
  // Write index row for last event ID-areaperil ID combination
  if (convertToBin_) WriteIdxFootprintFile();

}